

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_view.c
# Opt level: O1

StringView CpuFeatures_StringView_TrimWhitespace(StringView view)

{
  ushort **ppuVar1;
  size_t sVar2;
  size_t sVar3;
  char *pcVar4;
  bool bVar5;
  StringView SVar6;
  
  sVar3 = view.size;
  pcVar4 = view.ptr;
  if (sVar3 != 0) {
    ppuVar1 = __ctype_b_loc();
    do {
      if ((*(byte *)((long)*ppuVar1 + (long)*pcVar4 * 2 + 1) & 0x20) == 0) break;
      pcVar4 = pcVar4 + 1;
      bVar5 = sVar3 != 0;
      sVar2 = sVar3 - 1;
      sVar3 = sVar2;
      if (!bVar5) {
        sVar3 = 0;
      }
    } while (bVar5 && sVar2 != 0);
  }
  if (sVar3 != 0) {
    ppuVar1 = __ctype_b_loc();
    do {
      if ((*(byte *)((long)*ppuVar1 + (long)pcVar4[sVar3 - 1] * 2 + 1) & 0x20) == 0) break;
      bVar5 = sVar3 != 0;
      sVar2 = sVar3 - 1;
      sVar3 = sVar2;
      if (!bVar5) {
        sVar3 = 0;
      }
    } while (bVar5 && sVar2 != 0);
  }
  SVar6.size = sVar3;
  SVar6.ptr = pcVar4;
  return SVar6;
}

Assistant:

StringView CpuFeatures_StringView_TrimWhitespace(StringView view) {
  while (view.size && isspace(CpuFeatures_StringView_Front(view)))
    view = CpuFeatures_StringView_PopFront(view, 1);
  while (view.size && isspace(CpuFeatures_StringView_Back(view)))
    view = CpuFeatures_StringView_PopBack(view, 1);
  return view;
}